

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O2

UVec4 __thiscall tcu::getFormatMaxUintValue(tcu *this,TextureFormat *format)

{
  ChannelOrder CVar1;
  undefined8 in_RDX;
  undefined8 uVar2;
  undefined8 extraout_RDX;
  uint s;
  UVec4 UVar3;
  
  CVar1 = format->order;
  uVar2 = CONCAT71((int7)((ulong)in_RDX >> 8),CVar1 == RGBA);
  if ((CVar1 == BGRA || CVar1 == RGBA) && format->type == UNSIGNED_INT_1010102_REV) {
    *(undefined8 *)this = 0x3ff000003ff;
    *(undefined8 *)(this + 8) = 0x3000003ff;
  }
  else {
    switch(format->type) {
    case UNSIGNED_INT8:
      s = 0xff;
      break;
    case UNSIGNED_INT16:
      s = 0xffff;
      break;
    case UNSIGNED_INT24:
      s = 0xffffff;
      break;
    case UNSIGNED_INT32:
      s = 0xffffffff;
      break;
    default:
      s = 0;
    }
    Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)this,s);
    uVar2 = extraout_RDX;
  }
  UVar3.m_data[2] = (int)uVar2;
  UVar3.m_data[3] = (int)((ulong)uVar2 >> 0x20);
  UVar3.m_data._0_8_ = this;
  return (UVec4)UVar3.m_data;
}

Assistant:

UVec4 getFormatMaxUintValue (const TextureFormat& format)
{
	DE_ASSERT(getTextureChannelClass(format.type) == TEXTURECHANNELCLASS_UNSIGNED_INTEGER);

	if (format == TextureFormat(TextureFormat::RGBA, TextureFormat::UNSIGNED_INT_1010102_REV) ||
		format == TextureFormat(TextureFormat::BGRA, TextureFormat::UNSIGNED_INT_1010102_REV))
		return UVec4(1023u, 1023u, 1023u, 3u);

	switch (format.type)
	{
		case TextureFormat::UNSIGNED_INT8:	return UVec4(std::numeric_limits<deUint8>::max());
		case TextureFormat::UNSIGNED_INT16:	return UVec4(std::numeric_limits<deUint16>::max());
		case TextureFormat::UNSIGNED_INT24:	return UVec4(0xffffffu);
		case TextureFormat::UNSIGNED_INT32:	return UVec4(std::numeric_limits<deUint32>::max());

		default:
			DE_FATAL("Invalid channel type");
			return UVec4(0);
	}
}